

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::report_query(ConsoleReporter *this,QueryData *in)

{
  ostream *poVar1;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  QueryData *in_local;
  ConsoleReporter *this_local;
  
  if ((this->opt->version & 1U) == 0) {
    if ((this->opt->help & 1U) == 0) {
      if ((this->opt->list_reporters & 1U) == 0) {
        if (((this->opt->count & 1U) == 0) && ((this->opt->list_test_cases & 1U) == 0)) {
          if ((this->opt->list_test_suites & 1U) != 0) {
            poVar1 = Color::operator<<(this->s,Cyan);
            poVar1 = std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<(poVar1,None);
            std::operator<<(poVar1,"listing all test suites\n");
            separator_to_stream(this);
            for (local_20 = 0; local_20 < in->num_data; local_20 = local_20 + 1) {
              poVar1 = Color::operator<<(this->s,None);
              poVar1 = std::operator<<(poVar1,in->data[local_20]->m_test_suite);
              std::operator<<(poVar1,"\n");
            }
            separator_to_stream(this);
            poVar1 = Color::operator<<(this->s,Cyan);
            poVar1 = std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<(poVar1,None);
            poVar1 = std::operator<<(poVar1,"unskipped test cases passing the current filters: ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(detail::g_cs + 0x90));
            std::operator<<(poVar1,"\n");
            poVar1 = Color::operator<<(this->s,Cyan);
            poVar1 = std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<(poVar1,None);
            poVar1 = std::operator<<(poVar1,
                                     "test suites with unskipped test cases passing the current filters: "
                                    );
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(detail::g_cs + 0x94));
            std::operator<<(poVar1,"\n");
          }
        }
        else {
          if ((this->opt->list_test_cases & 1U) != 0) {
            poVar1 = Color::operator<<(this->s,Cyan);
            poVar1 = std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<(poVar1,None);
            std::operator<<(poVar1,"listing all test case names\n");
            separator_to_stream(this);
          }
          for (local_1c = 0; local_1c < in->num_data; local_1c = local_1c + 1) {
            poVar1 = Color::operator<<(this->s,None);
            poVar1 = std::operator<<(poVar1,in->data[local_1c]->m_name);
            std::operator<<(poVar1,"\n");
          }
          separator_to_stream(this);
          poVar1 = Color::operator<<(this->s,Cyan);
          poVar1 = std::operator<<(poVar1,"[doctest] ");
          poVar1 = Color::operator<<(poVar1,None);
          poVar1 = std::operator<<(poVar1,"unskipped test cases passing the current filters: ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(detail::g_cs + 0x90));
          std::operator<<(poVar1,"\n");
        }
      }
      else {
        printRegisteredReporters(this);
      }
    }
    else {
      printHelp(this);
    }
  }
  else {
    printVersion(this);
  }
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            if(opt.version) {
                printVersion();
            } else if(opt.help) {
                printHelp();
            } else if(opt.list_reporters) {
                printRegisteredReporters();
            } else if(opt.count || opt.list_test_cases) {
                if(opt.list_test_cases) {
                    s << Color::Cyan << "[doctest] " << Color::None
                      << "listing all test case names\n";
                    separator_to_stream();
                }

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_name << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";

            } else if(opt.list_test_suites) {
                s << Color::Cyan << "[doctest] " << Color::None << "listing all test suites\n";
                separator_to_stream();

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_test_suite << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";
                s << Color::Cyan << "[doctest] " << Color::None
                  << "test suites with unskipped test cases passing the current filters: "
                  << g_cs->numTestSuitesPassingFilters << "\n";
            }
        }